

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *params_1,anon_enum_32 *params_2,int *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *params_00;
  anon_enum_32 *params_01;
  int *params_02;
  long lVar4;
  undefined4 in_register_00000034;
  size_t sVar5;
  String *in_stack_ffffffffffffff58;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  sVar5 = CONCAT44(in_register_00000034,line);
  str<char_const(&)[46]>
            (&local_98,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [46])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<__11,int&>&>(&local_80,(kj *)macroArgs,params_00);
  str<__11&>(&local_68,(kj *)(ulong)*(uint *)*params,params_01);
  str<int&>(&local_50,(kj *)params_1,params_02);
  argValues.size_ = sVar5;
  argValues.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,(LogSeverity)sVar5,(char *)&local_98,argValues);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}